

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SnapshotEventLogEntry_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapshotEventLogEntry *pSVar3;
  int64 iVar4;
  TTD_LOG_PTR_ID *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32 i;
  ulong uVar6;
  uint32 i_1;
  
  pSVar3 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (evt);
  iVar4 = FileReader::ReadInt64(reader,restoreTime,true);
  pSVar3->RestoreTimestamp = iVar4;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  pSVar3->LiveContextCount = uVar1;
  if (uVar1 == 0) {
    pTVar5 = (TTD_LOG_PTR_ID *)0x0;
  }
  else {
    pTVar5 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_long>(alloc,(ulong)uVar1);
  }
  pSVar3->LiveContextIdArray = pTVar5;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (uVar6 = 0; uVar6 < pSVar3->LiveContextCount; uVar6 = uVar6 + 1) {
    iVar2 = (*reader->_vptr_FileReader[0x11])(reader,(ulong)(uVar6 != 0));
    pSVar3->LiveContextIdArray[uVar6] = CONCAT44(extraout_var,iVar2);
  }
  (*reader->_vptr_FileReader[5])(reader);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  pSVar3->LongLivedRefRootsCount = uVar1;
  if (uVar1 == 0) {
    pTVar5 = (TTD_LOG_PTR_ID *)0x0;
  }
  else {
    pTVar5 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_long>(alloc,(ulong)uVar1);
  }
  pSVar3->LongLivedRefRootsIdArray = pTVar5;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (uVar6 = 0; uVar6 < pSVar3->LongLivedRefRootsCount; uVar6 = uVar6 + 1) {
    iVar2 = (*reader->_vptr_FileReader[0x11])(reader,(ulong)(uVar6 != 0));
    pSVar3->LongLivedRefRootsIdArray[uVar6] = CONCAT44(extraout_var_00,iVar2);
  }
  (*reader->_vptr_FileReader[5])(reader);
  pSVar3->Snap = (SnapShot *)0x0;
  return;
}

Assistant:

void SnapshotEventLogEntry_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            snapEvt->RestoreTimestamp = reader->ReadInt64(NSTokens::Key::restoreTime, true);

            snapEvt->LiveContextCount = reader->ReadLengthValue(true);
            snapEvt->LiveContextIdArray = (snapEvt->LiveContextCount != 0) ? alloc.SlabAllocateArray<TTD_LOG_PTR_ID>(snapEvt->LiveContextCount) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < snapEvt->LiveContextCount; ++i)
            {
                snapEvt->LiveContextIdArray[i] = reader->ReadNakedLogTag(i != 0);
            }
            reader->ReadSequenceEnd();

            snapEvt->LongLivedRefRootsCount = reader->ReadLengthValue(true);
            snapEvt->LongLivedRefRootsIdArray = (snapEvt->LongLivedRefRootsCount != 0) ? alloc.SlabAllocateArray<TTD_LOG_PTR_ID>(snapEvt->LongLivedRefRootsCount) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < snapEvt->LongLivedRefRootsCount; ++i)
            {
                snapEvt->LongLivedRefRootsIdArray[i] = reader->ReadNakedLogTag(i != 0);
            }
            reader->ReadSequenceEnd();

            snapEvt->Snap = nullptr;
        }